

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# desugarer.cpp
# Opt level: O2

DesugaredObject * __thiscall
jsonnet::internal::Desugarer::stdlibAST(Desugarer *this,string *filename)

{
  __normal_iterator<jsonnet::internal::DesugaredObject::Field_*,_std::vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>_>
  __last;
  _Alloc_hider _Var1;
  pointer pbVar2;
  uint uVar3;
  DesugaredObject *pDVar4;
  BuiltinFunction *pBVar5;
  __normal_iterator<jsonnet::internal::DesugaredObject::Field_*,_std::vector<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>_>
  _Var6;
  ostream *poVar7;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *p;
  pointer s;
  long lVar8;
  char cVar9;
  long lVar10;
  unsigned_long uVar11;
  BuiltinFunction *fn;
  LiteralString *name;
  Identifiers params;
  AST *std_ast;
  Tokens tokens;
  allocator<char32_t> local_129;
  BuiltinFunction *local_128;
  undefined1 local_120 [32];
  vector<jsonnet::internal::DesugaredObject::Field,std::allocator<jsonnet::internal::DesugaredObject::Field>>
  *local_100;
  unsigned_long local_f8;
  LiteralString *local_f0;
  _Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
  local_e8;
  BuiltinDecl local_d0;
  string *local_98;
  DesugaredObject *local_90;
  AST *local_88;
  _List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> local_80;
  BuiltinDecl local_68;
  
  local_98 = filename;
  ::std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_d0,"std.jsonnet",(allocator<char> *)local_120);
  jsonnet_lex((Tokens *)&local_80,(string *)&local_d0,
              "/*\nCopyright 2015 Google Inc. All rights reserved.\n\nLicensed under the Apache License, Version 2.0 (the \"License\");\nyou may not use this file except in compliance with the License.\nYou may obtain a copy of the License at\n\n    http://www.apache.org/licenses/LICENSE-2.0\n\nUnless required by applicable law or agreed to in writing, software\ndistributed under the License is distributed on an \"AS IS\" BASIS,\nWITHOUT WARRANTIES OR CONDITIONS OF ANY KIND, either express or implied.\nSee the License for the specific language governing permissions and\nlimitations under the License.\n*/\n\n/* This is the Jsonnet standard library, at least the parts of it that are written in Jsonnet.\n *\n * There are some native methods as well, which are defined in the interpreter and added to this\n * file.  It is never necessary to import std.jsonnet, it is embedded into the interpreter at\n * compile-time and automatically imported into all other Jsonnet programs.\n */\n{\n\n  local std = self,\n  local id = function(x) x,\n\n  local go_only_function = error \'This function is only supported in go version of jsonnet. See https://github.com/google/go-jsonnet\',\n\n  isString(v):: std.type(v) == \'string\',\n  isNumber(v):: std.type(v) == \'number\',\n  isBoolean(v):: std.type(v) == \'boolean\',\n  isObject(v):: std.type(v) == \'object\',\n  isArray(v):: std.type(v) == \'array\',\n  isFunction(v):: std.type(v) == \'function\',\n\n  toString(a)::\n    if std.type(a) == \'string\' then a else \'\' + a,\n\n  substr(str, from, len)::\n    assert std.isString(str) : \'substr first parameter should be a string, got \' + std.type(str);\n    assert std.isNumber(from) : \'substr second parameter should be a string, got \' + std.type(from);\n    assert std.isNumber(len) : \'substr third parameter should be a string, got \' + std.type(len);\n    assert len >= 0 : \'substr third parameter should be greater than zero, got \' + len;\n    std.join(\'\', std.makeArray(std.max(0, std.min(len, std.length(str) - from)), function(i) str[i + from])),\n\n  startsWith(a, b)::\n    if std.length(a) < std.length(b) then\n      ..." /* TRUNCATED STRING LITERAL */
             );
  ::std::__cxx11::string::~string((string *)&local_d0);
  local_88 = jsonnet_parse(this->alloc,(Tokens *)&local_80);
  desugar(this,&local_88,0);
  if ((local_88 != (AST *)0x0) &&
     (pDVar4 = (DesugaredObject *)
               __dynamic_cast(local_88,&AST::typeinfo,&DesugaredObject::typeinfo,0),
     pDVar4 != (DesugaredObject *)0x0)) {
    local_100 = (vector<jsonnet::internal::DesugaredObject::Field,std::allocator<jsonnet::internal::DesugaredObject::Field>>
                 *)&pDVar4->fields;
    local_90 = pDVar4;
    for (uVar11 = 0; uVar11 != 0x29; uVar11 = uVar11 + 1) {
      local_f8 = uVar11;
      jsonnet_builtin_decl(&local_d0,uVar11);
      pbVar2 = local_d0.params.
               super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      for (s = local_d0.params.
               super__Vector_base<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_std::allocator<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; s != pbVar2; s = s + 1) {
        local_120._0_8_ = id(this,s);
        ::std::
        vector<jsonnet::internal::Identifier_const*,std::allocator<jsonnet::internal::Identifier_const*>>
        ::emplace_back<jsonnet::internal::Identifier_const*>
                  ((vector<jsonnet::internal::Identifier_const*,std::allocator<jsonnet::internal::Identifier_const*>>
                    *)&local_e8,(Identifier **)local_120);
      }
      local_f0 = str(this,&local_d0.name);
      _Var1._M_p = local_d0.name._M_dataplus._M_p;
      local_120._0_8_ = local_120 + 0x10;
      local_120._8_8_ = 0;
      local_120[0x10] = '\0';
      lVar8 = local_d0.name._M_string_length << 2;
      for (lVar10 = 0; lVar8 != lVar10; lVar10 = lVar10 + 4) {
        uVar3 = *(uint *)((long)_Var1._M_p + lVar10);
        if (0x10ffff < uVar3) {
          uVar3 = 0xfffd;
        }
        cVar9 = (char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120
        ;
        if (0x7f < uVar3) {
          if (uVar3 < 0x800) {
            ::std::__cxx11::string::push_back(cVar9);
          }
          else if (uVar3 < 0x10000) {
            ::std::__cxx11::string::push_back(cVar9);
            ::std::__cxx11::string::push_back(cVar9);
          }
          else {
            ::std::__cxx11::string::push_back(cVar9);
            ::std::__cxx11::string::push_back(cVar9);
            ::std::__cxx11::string::push_back(cVar9);
          }
        }
        ::std::__cxx11::string::push_back(cVar9);
      }
      pBVar5 = make<jsonnet::internal::BuiltinFunction,jsonnet::internal::LocationRange_const&,std::__cxx11::string,std::vector<jsonnet::internal::Identifier_const*,std::allocator<jsonnet::internal::Identifier_const*>>&>
                         (this,(LocationRange *)E,
                          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_120,
                          (vector<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
                           *)&local_e8);
      ::std::__cxx11::string::~string((string *)local_120);
      pDVar4 = local_90;
      _Var6._M_current =
           (local_90->fields).
           super__Vector_base<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
           ._M_impl.super__Vector_impl_data._M_start;
      __last._M_current =
           (local_90->fields).
           super__Vector_base<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_128 = pBVar5;
      BuiltinDecl::BuiltinDecl(&local_68,&local_d0);
      _Var6 = ::std::
              find_if<__gnu_cxx::__normal_iterator<jsonnet::internal::DesugaredObject::Field*,std::vector<jsonnet::internal::DesugaredObject::Field,std::allocator<jsonnet::internal::DesugaredObject::Field>>>,jsonnet::internal::Desugarer::stdlibAST(std::__cxx11::string)::_lambda(jsonnet::internal::DesugaredObject::Field_const&)_1_>
                        (_Var6,__last,(anon_class_56_1_898aa9a8_for__M_pred *)&local_68);
      BuiltinDecl::~BuiltinDecl(&local_68);
      if (_Var6._M_current ==
          (pDVar4->fields).
          super__Vector_base<jsonnet::internal::DesugaredObject::Field,_std::allocator<jsonnet::internal::DesugaredObject::Field>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        local_120._0_8_ = local_120._0_8_ & 0xffffffff00000000;
        ::std::
        vector<jsonnet::internal::DesugaredObject::Field,std::allocator<jsonnet::internal::DesugaredObject::Field>>
        ::
        emplace_back<jsonnet::internal::ObjectField::Hide,jsonnet::internal::LiteralString*&,jsonnet::internal::BuiltinFunction*&>
                  (local_100,(Hide *)local_120,&local_f0,&local_128);
      }
      else {
        (_Var6._M_current)->body = &local_128->super_AST;
      }
      uVar11 = local_f8;
      ::std::
      _Vector_base<const_jsonnet::internal::Identifier_*,_std::allocator<const_jsonnet::internal::Identifier_*>_>
      ::~_Vector_base(&local_e8);
      BuiltinDecl::~BuiltinDecl(&local_d0);
    }
    local_128 = (BuiltinFunction *)((ulong)local_128 & 0xffffffff00000000);
    ::std::__cxx11::u32string::u32string<std::allocator<char32_t>>
              ((u32string *)&local_d0,L"thisFile",&local_129);
    local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)str(this,&local_d0.name);
    decode_utf8((UString *)local_120,local_98);
    local_f0 = str(this,(UString *)local_120);
    ::std::
    vector<jsonnet::internal::DesugaredObject::Field,std::allocator<jsonnet::internal::DesugaredObject::Field>>
    ::
    emplace_back<jsonnet::internal::ObjectField::Hide,jsonnet::internal::LiteralString*,jsonnet::internal::LiteralString*>
              (local_100,(Hide *)&local_128,(LiteralString **)&local_e8,&local_f0);
    ::std::__cxx11::u32string::~u32string((u32string *)local_120);
    ::std::__cxx11::u32string::~u32string((u32string *)&local_d0);
    ::std::__cxx11::_List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_>
    ::_M_clear(&local_80);
    return pDVar4;
  }
  poVar7 = ::std::operator<<((ostream *)&::std::cerr,"INTERNAL ERROR: std.jsonnet not an object.");
  ::std::endl<char,std::char_traits<char>>(poVar7);
  abort();
}

Assistant:

DesugaredObject *stdlibAST(std::string filename) {
        // Now, implement the std library by wrapping in a local construct.
        Tokens tokens = jsonnet_lex("std.jsonnet", STD_CODE);
        AST *std_ast = jsonnet_parse(alloc, tokens);
        desugar(std_ast, 0);
        auto *std_obj = dynamic_cast<DesugaredObject *>(std_ast);
        if (std_obj == nullptr) {
            std::cerr << "INTERNAL ERROR: std.jsonnet not an object." << std::endl;
            std::abort();
        }

        // Bind 'std' builtins that are implemented natively.
        DesugaredObject::Fields &fields = std_obj->fields;
        for (unsigned long c = 0; c <= max_builtin; ++c) {
            const auto &decl = jsonnet_builtin_decl(c);
            Identifiers params;
            for (const auto &p : decl.params)
                params.push_back(id(p));
            auto name = str(decl.name);
            auto fn = make<BuiltinFunction>(E, encode_utf8(decl.name), params);
            auto field = std::find_if(fields.begin(), fields.end(),
                [=](const DesugaredObject::Field& f) {
                    return static_cast<LiteralString*>(f.name)->value == decl.name;
                });
            if (field != fields.end()) {
                field->body = fn;
            } else {
                fields.emplace_back(ObjectField::HIDDEN, name, fn);
            }
        }
        fields.emplace_back(
            ObjectField::HIDDEN, str(U"thisFile"), str(decode_utf8(filename)));
        return std_obj;
    }